

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::TrackObjTypeSpecProperties(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  Type TVar1;
  Type pJVar2;
  ThreadContextInfo *pTVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  uint16 uVar8;
  uint16 uVar9;
  PropertyId PVar10;
  PropertyId PVar11;
  uint uVar12;
  uint functionId;
  uint uVar13;
  undefined4 *puVar14;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *pHVar15;
  StackSym *pSVar16;
  ObjTypeGuardBucket *pOVar17;
  BVSparse<Memory::JitArenaAllocator> *pBVar18;
  ObjTypeSpecFldInfo *this_00;
  EquivalentTypeSet *leftTypeSet;
  EquivalentTypeSet *rightTypeSet;
  JITTimeFunctionBody *this_01;
  char16 *pcVar19;
  char16 *pcVar20;
  PropertyRecord *pPVar21;
  JITTypeHolder JVar22;
  undefined1 *puVar23;
  ThreadContext *this_02;
  BackwardPass *this_03;
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  BVUnitT<unsigned_long> local_68;
  SparseBVUnit _unit;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar6) goto LAB_003d3a4e;
    *puVar14 = 0;
  }
  bVar6 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(opnd);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159b,"(opnd->IsTypeCheckSeqCandidate())","opnd->IsTypeCheckSeqCandidate()"
                      );
    if (!bVar6) goto LAB_003d3a4e;
    *puVar14 = 0;
  }
  bVar6 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(opnd);
  if (bVar6) {
    pHVar15 = block->stackSymToGuardedProperties;
    if (pHVar15 == (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
      pHVar15 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::New
                          (&this->tempAlloc->super_ArenaAllocator,8);
      block->stackSymToGuardedProperties = pHVar15;
    }
    pSVar16 = IR::PropertySymOpnd::GetObjectSym(opnd);
    pOVar17 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                        (pHVar15,(pSVar16->super_Sym).m_id);
    pBVar18 = pOVar17->guardedPropertyOps;
    if (pBVar18 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar18 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3d6ef4);
      pJVar2 = this->tempAlloc;
      pBVar18->head = (Type_conflict)0x0;
      pBVar18->lastFoundIndex = (Type_conflict)0x0;
      pBVar18->alloc = pJVar2;
      pBVar18->lastUsedNodePrevNextField = (Type)pBVar18;
      pOVar17->guardedPropertyOps = pBVar18;
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    _unit.word = (Type)pBVar18;
    while (pBVar18 = (BVSparse<Memory::JitArenaAllocator> *)pBVar18->head,
          pBVar18 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      TVar1 = *(Type *)&pBVar18->lastFoundIndex;
      local_68.word = ((Type *)&pBVar18->alloc)->word;
LAB_003d358c:
      if (local_68.word != 0) {
        lVar4 = 0;
        if (local_68.word != 0) {
          for (; (local_68.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        BVUnitT<unsigned_long>::Clear(&local_68,(BVIndex)lVar4);
        this_00 = Func::GetGlobalObjTypeSpecFldInfo(this->func,(BVIndex)lVar4 + TVar1);
        if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x15b8,"(existingFldInfo != nullptr)","existingFldInfo != nullptr");
          if (!bVar6) goto LAB_003d3a4e;
          *puVar14 = 0;
        }
        PVar10 = ObjTypeSpecFldInfo::GetPropertyId(this_00);
        PVar11 = IR::PropertySymOpnd::GetPropertyId(opnd);
        if (PVar10 == PVar11) {
          uVar12 = Func::GetSourceContextId(this->func);
          functionId = Func::GetLocalFunctionId(this->func);
          bVar6 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar12,functionId);
          if (((bVar6) && (bVar6 = ObjTypeSpecFldInfo::IsPoly(this_00), bVar6)) &&
             (bVar6 = IR::PropertySymOpnd::IsPoly(opnd), bVar6)) {
            leftTypeSet = ObjTypeSpecFldInfo::GetEquivalentTypeSet(this_00);
            rightTypeSet = IR::PropertySymOpnd::GetEquivalentTypeSet(opnd);
            bVar6 = GlobOpt::AreTypeSetsIdentical(leftTypeSet,rightTypeSet);
            if (bVar6) {
              uVar8 = ObjTypeSpecFldInfo::GetSlotIndex(this_00);
              uVar9 = IR::PropertySymOpnd::GetSlotIndex(opnd);
              if (uVar8 == uVar9) goto LAB_003d358c;
            }
            this_01 = Func::GetJITFunctionBody(this->func);
            pcVar19 = JITTimeFunctionBody::GetDisplayName(this_01);
            pcVar20 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_e8);
            pTVar3 = this->func->m_threadContextInfo;
            this_02 = (ThreadContext *)pTVar3[-3].wellKnownHostTypeIds;
            if (pTVar3 == (ThreadContextInfo *)0x0) {
              this_02 = (ThreadContext *)0x0;
            }
            PVar10 = IR::PropertySymOpnd::GetPropertyId(opnd);
            pPVar21 = ThreadContext::GetPropertyRecord(this_02,PVar10);
            uVar13 = IR::PropertySymOpnd::GetPropertyId(opnd);
            uVar12 = IR::PropertySymOpnd::GetObjTypeSpecFldId(opnd);
            Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"
                          ,pcVar19,pcVar20,pPVar21 + 1,(ulong)uVar13,(ulong)uVar12);
            Output::Flush();
          }
        }
        goto LAB_003d358c;
      }
    }
    uVar12 = IR::PropertySymOpnd::GetObjTypeSpecFldId(opnd);
    ObjTypeGuardBucket::AddToGuardedPropertyOps(pOVar17,uVar12);
    bVar6 = IR::PropertySymOpnd::NeedsMonoCheck(opnd);
    if (bVar6) {
      bVar6 = IR::PropertySymOpnd::IsMono(opnd);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x15df,"(opnd->IsMono())","opnd->IsMono()");
        if (!bVar6) goto LAB_003d3a4e;
        *puVar14 = 0;
      }
      if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x10) == 0) {
        JVar22 = IR::PropertySymOpnd::GetType(opnd);
      }
      else {
        JVar22 = IR::PropertySymOpnd::GetInitialType(opnd);
      }
      (pOVar17->monoGuardType).t = JVar22.t;
    }
    bVar6 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(opnd);
    if (bVar6) {
      IR::PropertySymOpnd::EnsureGuardedPropOps(opnd,this->func->m_alloc);
      IR::PropertySymOpnd::AddGuardedPropOps(opnd,(BVSparse<Memory::JitArenaAllocator> *)_unit.word)
      ;
      bVar6 = IR::Instr::HasTypeCheckBailOut(this->currentInstr);
      if (bVar6) {
        bVar6 = ObjTypeGuardBucket::NeedsMonoCheck(pOVar17);
        if (bVar6) {
          bVar6 = IR::Instr::HasEquivalentTypeCheckBailOut(this->currentInstr);
          if (bVar6) {
            bVar6 = IR::PropertySymOpnd::SetMonoGuardType(opnd,(pOVar17->monoGuardType).t);
            if (!bVar6) {
              Func::ClearObjTypeSpecFldInfo(this->currentInstr->m_func,opnd->m_inlineCacheIndex);
              puVar23 = (undefined1 *)__cxa_allocate_exception(1);
              *puVar23 = 0x11;
              __cxa_throw(puVar23,&Js::RejitException::typeinfo,0);
            }
            IR::Instr::ChangeEquivalentToMonoTypeCheckBailOut(this->currentInstr);
          }
          this_03 = (BackwardPass *)(debugStringBuffer + 0x28);
          JITTypeHolderBase<void>::JITTypeHolderBase
                    ((JITTypeHolderBase<void> *)this_03,(JITType *)0x0);
          (pOVar17->monoGuardType).t = stack0xffffffffffffff70;
          ClearTypeIDWithFinalType(this_03,(pSVar16->super_Sym).m_id,block);
        }
        if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) == 0) {
          pOVar17->guardedPropertyOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->tempAlloc,(BVSparse<Memory::JitArenaAllocator> *)_unit.word);
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                    (block->stackSymToGuardedProperties,(pSVar16->super_Sym).m_id);
        }
      }
      pHVar15 = block->stackSymToGuardedProperties;
      pSVar16 = IR::PropertySymOpnd::GetObjectSym(opnd);
      pOVar17 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                          (pHVar15,(pSVar16->super_Sym).m_id);
      if (((pOVar17 != (ObjTypeGuardBucket *)0x0) &&
          (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) == 0)) &&
         (bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pOVar17->guardedPropertyOps), !bVar6)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1619,
                           "(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty())"
                           ,
                           "opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty()"
                          );
        if (!bVar6) goto LAB_003d3a4e;
        *puVar14 = 0;
      }
    }
  }
  else {
    bVar6 = IR::PropertySymOpnd::NeedsLocalTypeCheck(opnd);
    if (bVar6) {
      IR::PropertySymOpnd::EnsureGuardedPropOps(opnd,this->func->m_alloc);
      uVar12 = IR::PropertySymOpnd::GetObjTypeSpecFldId(opnd);
      IR::PropertySymOpnd::SetGuardedPropOp(opnd,uVar12);
    }
  }
  if ((((opnd->field_0x61 & 1) != 0) && (opnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0)) &&
     ((bVar6 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(opnd), bVar6 &&
      ((((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 0x20) == 0 &&
       (bVar6 = IR::PropertySymOpnd::IsLoadedFromProto(opnd), !bVar6)))))) {
    pSVar16 = IR::PropertySymOpnd::GetAuxSlotPtrSym(opnd);
    if (((ushort)opnd->field_12 & 4) == 0) {
      if (pSVar16 == (StackSym *)0x0) {
        return;
      }
      BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                        (this->currentBlock->upwardExposedUses,(pSVar16->super_Sym).m_id);
    }
    else {
      if (pSVar16 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x162b,"(auxSlotPtrSym)","auxSlotPtrSym");
        if (!bVar6) {
LAB_003d3a4e:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar14 = 0;
      }
      BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        (this->currentBlock->upwardExposedUses,(pSVar16->super_Sym).m_id);
    }
    if ((BVar7 != '\0') && (this->currentPrePassLoop == (Loop *)0x0)) {
      IR::PropertySymOpnd::SetProducesAuxSlotPtr(opnd,true);
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecProperties(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(opnd->IsTypeCheckSeqCandidate());

    // Now that we're in the dead store pass and we know definitively which operations will have a type
    // check and which are protected by an upstream type check, we can push the lists of guarded properties
    // up the flow graph and drop them on the type checks for the corresponding object symbol.
    if (opnd->IsTypeCheckSeqParticipant())
    {
        // Add this operation to the list of guarded operations for this object symbol.
        HashTable<ObjTypeGuardBucket>* stackSymToGuardedProperties = block->stackSymToGuardedProperties;
        if (stackSymToGuardedProperties == nullptr)
        {
            stackSymToGuardedProperties = HashTable<ObjTypeGuardBucket>::New(this->tempAlloc, 8);
            block->stackSymToGuardedProperties = stackSymToGuardedProperties;
        }

        StackSym* objSym = opnd->GetObjectSym();
        ObjTypeGuardBucket* bucket = stackSymToGuardedProperties->FindOrInsertNew(objSym->m_id);
        BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
        if (guardedPropertyOps == nullptr)
        {
            // The bit vectors we push around the flow graph only need to live as long as this phase.
            guardedPropertyOps = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
            bucket->SetGuardedPropertyOps(guardedPropertyOps);
        }

#if DBG
        FOREACH_BITSET_IN_SPARSEBV(propOpId, guardedPropertyOps)
        {
            ObjTypeSpecFldInfo* existingFldInfo = this->func->GetGlobalObjTypeSpecFldInfo(propOpId);
            Assert(existingFldInfo != nullptr);

            if (existingFldInfo->GetPropertyId() != opnd->GetPropertyId())
            {
                continue;
            }
            // It would be very nice to assert that the info we have for this property matches all properties guarded thus far.
            // Unfortunately, in some cases of object pointer copy propagation into a loop, we may end up with conflicting
            // information for the same property. We simply ignore the conflict and emit an equivalent type check, which
            // will attempt to check for one property on two different slots, and obviously fail. Thus we may have a
            // guaranteed bailout, but we'll simply re-JIT with equivalent object type spec disabled. To avoid this
            // issue altogether, we would need to track the set of guarded properties along with the type value in the
            // forward pass, and when a conflict is detected either not optimize the offending instruction, or correct
            // its information based on the info from the property in the type value info.
            //Assert(!existingFldInfo->IsPoly() || !opnd->IsPoly() || GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()));
            //Assert(existingFldInfo->GetSlotIndex() == opnd->GetSlotIndex());

            if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->func) && !JITManager::GetJITManager()->IsJITServer())
            {
                if (existingFldInfo->IsPoly() && opnd->IsPoly() &&
                    (!GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()) ||
                    (existingFldInfo->GetSlotIndex() != opnd->GetSlotIndex())))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"),
                        this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer),
                        this->func->GetInProcThreadContext()->GetPropertyRecord(opnd->GetPropertyId())->GetBuffer(), opnd->GetPropertyId(), opnd->GetObjTypeSpecFldId());
                    Output::Flush();
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV
#endif

        bucket->AddToGuardedPropertyOps(opnd->GetObjTypeSpecFldId());

        if (opnd->NeedsMonoCheck())
        {
            Assert(opnd->IsMono());
            JITTypeHolder monoGuardType = opnd->IsInitialTypeChecked() ? opnd->GetInitialType() : opnd->GetType();
            bucket->SetMonoGuardType(monoGuardType);
        }

        if (opnd->NeedsPrimaryTypeCheck())
        {
            // Grab the guarded properties which match this type check with respect to polymorphism and drop them
            // on the operand. Only equivalent type checks can protect polymorphic properties to avoid a case where
            // we have 1) a cache with type set {t1, t2} and property a, followed by 2) a cache with type t3 and
            // property b, and 3) a cache with type set {t1, t2} and property c, where the slot index of property c
            // on t1 and t2 is different than on t3. If cache 2 were to protect property c it would not verify that
            // it resides on the correct slot for cache 3.  Yes, an equivalent type check could protect monomorphic
            // properties, but it would then unnecessarily verify their equivalence on the slow path.

            // Also, make sure the guarded properties on the operand are allocated from the func's allocator to
            // persists until lowering.

            Assert(guardedPropertyOps != nullptr);
            opnd->EnsureGuardedPropOps(this->func->m_alloc);
            opnd->AddGuardedPropOps(guardedPropertyOps);
            if (this->currentInstr->HasTypeCheckBailOut())
            {
                // Stop pushing the mono guard type up if it is being checked here.
                if (bucket->NeedsMonoCheck())
                {
                    if (this->currentInstr->HasEquivalentTypeCheckBailOut())
                    {
                        // Some instr protected by this one requires a monomorphic type check. (E.g., final type opt,
                        // fixed field not loaded from prototype.) Note the IsTypeAvailable test above: only do this at
                        // the initial type check that protects this path.
                        if (!opnd->SetMonoGuardType(bucket->GetMonoGuardType()))
                        {
                            // We can't safely check for the required type here. Clear the objtypespec info to disable optimization
                            // using this inline cache, since there appears to be a mismatch, and re-jit.
                            // (Dead store pass is too late to generate the bailout points we need to use this type correctly.)
                            this->currentInstr->m_func->ClearObjTypeSpecFldInfo(opnd->m_inlineCacheIndex);
                            throw Js::RejitException(RejitReason::FailedEquivalentTypeCheck);
                        }
                        this->currentInstr->ChangeEquivalentToMonoTypeCheckBailOut();
                    }
                    bucket->SetMonoGuardType(nullptr);
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }

                if (!opnd->IsTypeAvailable())
                {
                    // Stop tracking the guarded properties if there's not another type check upstream.
                    bucket->SetGuardedPropertyOps(nullptr);
                    JitAdelete(this->tempAlloc, guardedPropertyOps);
                    block->stackSymToGuardedProperties->Clear(objSym->m_id);
                }
            }
#if DBG
            {
                // If there is no upstream type check that is live and could protect guarded properties, we better
                // not have any properties remaining.
                ObjTypeGuardBucket* objTypeGuardBucket = block->stackSymToGuardedProperties->Get(opnd->GetObjectSym()->m_id);
                Assert(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty());
            }
#endif
        }
    }
    else if (opnd->NeedsLocalTypeCheck())
    {
        opnd->EnsureGuardedPropOps(this->func->m_alloc);
        opnd->SetGuardedPropOp(opnd->GetObjTypeSpecFldId());
    }

    if (opnd->UsesAuxSlot() && opnd->IsTypeCheckSeqParticipant() && !opnd->HasTypeMismatch() && !opnd->IsLoadedFromProto())
    {
        bool auxSlotPtrUpwardExposed = false;
        StackSym *auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
        if (opnd->IsAuxSlotPtrSymAvailable())
        {    
            // This is an upward-exposed use of the aux slot pointer.
            Assert(auxSlotPtrSym);
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndSet(auxSlotPtrSym->m_id);
        }
        else if (auxSlotPtrSym != nullptr)
        {
            // The aux slot pointer is not upward-exposed at this point.
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndClear(auxSlotPtrSym->m_id);
        }
        if (!this->IsPrePass() && auxSlotPtrUpwardExposed)
        {
            opnd->SetProducesAuxSlotPtr(true);
        }
    }
}